

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O0

bool __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::Contains
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,S2Cell *target)

{
  Iterator *this_00;
  Iterator *it;
  S2ClippedShape *clipped_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  S2CellId y;
  MutableS2ShapeIndex *this_01;
  S2Shape *pSVar5;
  int __c;
  bool local_cd;
  S2Point local_a8;
  uint64 local_90;
  S2CellId local_88;
  S2ClippedShape *local_80;
  S2ClippedShape *clipped;
  S2ShapeIndexCell *pSStack_70;
  int s;
  S2ShapeIndexCell *cell;
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_3d;
  uint64 local_3c;
  S2CellId local_34;
  uint64 local_2c;
  CellRelation local_24;
  S2Cell *pSStack_20;
  CellRelation relation;
  S2Cell *target_local;
  S2ShapeIndexRegion<MutableS2ShapeIndex> *this_local;
  
  this_00 = this->iter_;
  pSStack_20 = target;
  target_local = (S2Cell *)this;
  local_2c = (uint64)S2Cell::id(target);
  local_24 = MutableS2ShapeIndex::Iterator::Locate(this_00,(S2CellId)local_2c);
  if (local_24 == INDEXED) {
    local_34 = S2ShapeIndex::IteratorBase::id(&this->iter_->super_IteratorBase);
    local_3c = (uint64)S2Cell::id(pSStack_20);
    bVar1 = S2CellId::contains(&local_34,(S2CellId)local_3c);
    local_51 = 0;
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index_region.h"
                 ,0x104,kFatal,(ostream *)&std::cerr);
      local_51 = 1;
      poVar4 = S2LogMessage::stream(&local_50);
      poVar4 = std::operator<<(poVar4,"Check failed: iter_.id().contains(target.id()) ");
      S2LogMessageVoidify::operator&(&local_3d,poVar4);
    }
    if ((local_51 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
    }
    pSStack_70 = MutableS2ShapeIndex::Iterator::cell(this->iter_);
    for (clipped._4_4_ = 0; iVar3 = clipped._4_4_, iVar2 = S2ShapeIndexCell::num_clipped(pSStack_70)
        , iVar3 < iVar2; clipped._4_4_ = clipped._4_4_ + 1) {
      local_80 = S2ShapeIndexCell::clipped(pSStack_70,clipped._4_4_);
      local_88 = S2ShapeIndex::IteratorBase::id(&this->iter_->super_IteratorBase);
      y = S2Cell::id(pSStack_20);
      local_90 = y.id_;
      bVar1 = ::operator==(local_88,y);
      if (bVar1) {
        iVar3 = S2ClippedShape::num_edges(local_80);
        if ((iVar3 == 0) && (bVar1 = S2ClippedShape::contains_center(local_80), bVar1)) {
          return true;
        }
      }
      else {
        this_01 = (MutableS2ShapeIndex *)index(this,(char *)y.id_,__c);
        iVar3 = S2ClippedShape::shape_id(local_80);
        pSVar5 = MutableS2ShapeIndex::shape(this_01,iVar3);
        iVar3 = (*pSVar5->_vptr_S2Shape[4])();
        local_cd = false;
        if (iVar3 == 2) {
          bVar1 = AnyEdgeIntersects(this,local_80,pSStack_20);
          clipped_00 = local_80;
          local_cd = false;
          if (!bVar1) {
            it = this->iter_;
            S2Cell::GetCenter(&local_a8,pSStack_20);
            local_cd = S2ContainsPointQuery<MutableS2ShapeIndex>::ShapeContains
                                 (&this->contains_query_,it,clipped_00,&local_a8);
          }
        }
        if (local_cd != false) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::Contains(const S2Cell& target) const {
  S2ShapeIndex::CellRelation relation = iter_.Locate(target.id());

  // If the relation is DISJOINT, then "target" is not contained.  Similarly if
  // the relation is SUBDIVIDED then "target" is not contained, since index
  // cells are subdivided only if they (nearly) intersect too many edges.
  if (relation != S2ShapeIndex::INDEXED) return false;

  // Otherwise, the iterator points to an index cell containing "target".
  // If any shape contains the target cell, we return true.
  S2_DCHECK(iter_.id().contains(target.id()));
  const S2ShapeIndexCell& cell = iter_.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    // The shape contains the target cell iff the shape contains the cell
    // center and none of its edges intersects the (padded) cell interior.
    if (iter_.id() == target.id()) {
      if (clipped.num_edges() == 0 && clipped.contains_center()) return true;
    } else {
      // It is faster to call AnyEdgeIntersects() before Contains().
      if (index().shape(clipped.shape_id())->dimension() == 2 &&
          !AnyEdgeIntersects(clipped, target) &&
          contains_query_.ShapeContains(iter_, clipped, target.GetCenter())) {
        return true;
      }
    }
  }
  return false;
}